

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestMembrane::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  CVar1;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestMembrane::CallInterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  CVar4;
  CallContext<capnproto_test::capnp::test::TestMembrane::WaitForeverParams,_capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
  CVar5;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  undefined6 in_register_00000032;
  long *plVar7;
  Promise<void> PVar8;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar6;
  
  plVar7 = (long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffff) {
  case 0:
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,capnproto_test::capnp::test::TestMembrane::MakeThingResults>
                      ((Server *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),in_RCX);
    (**(code **)(*plVar7 + 8))(this,plVar7,CVar1.hook);
    pPVar6 = extraout_RDX;
    break;
  case 1:
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>
                      ((Server *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),in_RCX);
    (**(code **)(*plVar7 + 0x10))(this,plVar7,CVar2.hook);
    pPVar6 = extraout_RDX_00;
    break;
  case 2:
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::CallInterceptParams,capnproto_test::capnp::test::TestMembrane::Result>
                      ((Server *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),in_RCX);
    (**(code **)(*plVar7 + 0x18))(this,plVar7,CVar3.hook);
    pPVar6 = extraout_RDX_01;
    break;
  case 3:
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,capnproto_test::capnp::test::TestMembrane::LoopbackResults>
                      ((Server *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),in_RCX);
    (**(code **)(*plVar7 + 0x20))(this,plVar7,CVar4.hook);
    pPVar6 = extraout_RDX_02;
    break;
  case 4:
    CVar5 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::WaitForeverParams,capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
                      ((Server *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),in_RCX);
    (**(code **)(*plVar7 + 0x28))(this,plVar7,CVar5.hook);
    pPVar6 = extraout_RDX_03;
    break;
  default:
    PVar8 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar7 + *(long *)(*plVar7 + -0x18)),0x507c35,
                       0x9c0c);
    pPVar6 = PVar8.super_PromiseBase.node.ptr;
  }
  PVar8.super_PromiseBase.node.ptr = pPVar6;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestMembrane::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return makeThing(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::MakeThingParams,  ::capnproto_test::capnp::test::TestMembrane::MakeThingResults>(context));
    case 1:
      return callPassThrough(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context));
    case 2:
      return callIntercept(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::CallInterceptParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context));
    case 3:
      return loopback(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::LoopbackParams,  ::capnproto_test::capnp::test::TestMembrane::LoopbackResults>(context));
    case 4:
      return waitForever(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::WaitForeverParams,  ::capnproto_test::capnp::test::TestMembrane::WaitForeverResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMembrane",
          0xc07d8dcd80a69c0cull, methodId);
  }
}